

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization_utils.cpp
# Opt level: O0

vector<duckdb::LogicalType,_true> * duckdb::CMUtils::IntegralTypes(void)

{
  vector<duckdb::LogicalType,_true> *in_RDI;
  allocator_type *in_stack_ffffffffffffff18;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff20;
  initializer_list<duckdb::LogicalType> in_stack_ffffffffffffff28;
  LogicalTypeId in_stack_ffffffffffffff3f;
  LogicalType *in_stack_ffffffffffffff40;
  undefined1 **local_b0;
  undefined1 *local_78 [12];
  undefined8 *local_18;
  undefined8 local_10;
  
  LogicalType::LogicalType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  LogicalType::LogicalType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  LogicalType::LogicalType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  LogicalType::LogicalType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  local_18 = local_78;
  local_10 = 4;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x13e5e45);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff18);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x13e5e70);
  local_b0 = (undefined1 **)&local_18;
  do {
    local_b0 = local_b0 + -3;
    LogicalType::~LogicalType((LogicalType *)0x13e5e96);
  } while (local_b0 != local_78);
  return in_RDI;
}

Assistant:

const vector<LogicalType> CMUtils::IntegralTypes() {
	return {LogicalType::UTINYINT, LogicalType::USMALLINT, LogicalType::UINTEGER, LogicalType::UBIGINT};
}